

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_fromipport(char *ip,uint16_t port,sockaddr_in *addr)

{
  uint16_t uVar1;
  int iVar2;
  LogStream *this;
  SourceFile file;
  undefined1 local_1000 [12];
  Logger local_ff0;
  sockaddr_in *local_20;
  sockaddr_in *addr_local;
  char *pcStack_10;
  uint16_t port_local;
  char *ip_local;
  
  addr->sin_family = 2;
  local_20 = addr;
  addr_local._6_2_ = port;
  pcStack_10 = ip;
  uVar1 = hostToNetwork16(port);
  local_20->sin_port = uVar1;
  iVar2 = inet_pton(2,pcStack_10,&local_20->sin_addr);
  if (iVar2 < 1) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_1000,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0xc9,false);
    this = Logger::stream(&local_ff0);
    LogStream::operator<<(this,"sockets::sz_fromipport");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void sz_fromipport(const char* ip, uint16_t port, struct sockaddr_in* addr)
{
	addr->sin_family = AF_INET;
	addr->sin_port = hostToNetwork16(port);
	if (::inet_pton(AF_INET, ip, &addr->sin_addr) <= 0)
	{
		LOG_SYSERR << "sockets::sz_fromipport";
	}
}